

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

void drawGui(void)

{
  bool bVar1;
  char *name;
  char (*in_RCX) [4];
  Span local_30 [16];
  tl local_20 [16];
  ImVec2 local_10;
  
  if (parsedData == (cgltf_data *)0x0) {
    ImGui::Begin("drag & drop a glTF file##0",(bool *)0x0,0);
    ImGui::End();
  }
  else {
    ImVec2::ImVec2(&local_10,1.0,1.0);
    ImGui::PushStyleVar(1,&local_10);
    scratchStr();
    tl::toStringBuffer<tl::StrT<char>,char[4]>
              (local_20,(Span<char> *)&openedFilePath,(StrT<char> *)0x35a28f,in_RCX);
    scratchStr();
    name = tl::Span::operator_cast_to_char_(local_30);
    ImGui::Begin(name,(bool *)0x0,0);
    ImGui::PopStyleVar(1);
    bVar1 = ImGui::BeginTabBar("TopTabBar",0);
    if (bVar1) {
      bVar1 = ImGui::BeginTabItem("Scenes",(bool *)0x0,0);
      if (bVar1) {
        drawGui_scenesTab();
        ImGui::EndTabItem();
      }
      bVar1 = ImGui::BeginTabItem("Meshes",(bool *)0x0,0);
      if (bVar1) {
        drawGui_meshesTab();
        ImGui::EndTabItem();
      }
      bVar1 = ImGui::BeginTabItem("Textures",(bool *)0x0,0);
      if (bVar1) {
        drawGui_texturesTab();
        ImGui::EndTabItem();
      }
      bVar1 = ImGui::BeginTabItem("Buffers",(bool *)0x0,0);
      if (bVar1) {
        drawGui_buffersTab();
        ImGui::EndTabItem();
      }
      bVar1 = ImGui::BeginTabItem("BufferViews",(bool *)0x0,0);
      if (bVar1) {
        drawGui_bufferViewsTab();
        ImGui::EndTabItem();
      }
      bVar1 = ImGui::BeginTabItem("Accessors",(bool *)0x0,0);
      if (bVar1) {
        drawGui_accessorsTab();
        ImGui::EndTabItem();
      }
      bVar1 = ImGui::BeginTabItem("Materials",(bool *)0x0,0);
      if (bVar1) {
        drawGui_materialsTab();
        ImGui::EndTabItem();
      }
      bVar1 = ImGui::BeginTabItem("Skins",(bool *)0x0,0);
      if (bVar1) {
        drawGui_skins();
        ImGui::EndTabItem();
      }
      bVar1 = ImGui::BeginTabItem("Animations",(bool *)0x0,0);
      if (bVar1) {
        drawGui_animations();
        ImGui::EndTabItem();
      }
      bVar1 = ImGui::BeginTabItem("Cameras",(bool *)0x0,0);
      if (bVar1) {
        drawGui_cameras();
        ImGui::EndTabItem();
      }
      bVar1 = ImGui::BeginTabItem("Lights",(bool *)0x0,0);
      if (bVar1) {
        drawGui_lights();
        ImGui::EndTabItem();
      }
      bVar1 = ImGui::BeginTabItem("Options",(bool *)0x0,0);
      if (bVar1) {
        drawGui_options();
        ImGui::EndTabItem();
      }
      ImGui::EndTabBar();
    }
    ImGui::End();
  }
  return;
}

Assistant:

void drawGui()
{
    if(!parsedData) {
        ImGui::Begin("drag & drop a glTF file##0");
        ImGui::End();
        return;
    }

    ImGui::PushStyleVar(ImGuiStyleVar_WindowPadding, ImVec2(1,1));
    tl::toStringBuffer(scratchStr(), openedFilePath, "##0");
    ImGui::Begin(scratchStr());
    ImGui::PopStyleVar();

    if (ImGui::BeginTabBar("TopTabBar"))
    {
        if (ImGui::BeginTabItem("Scenes")) {
            drawGui_scenesTab();
            ImGui::EndTabItem();
        }
        if(ImGui::BeginTabItem("Meshes")) {
            drawGui_meshesTab();
            ImGui::EndTabItem();
        }
        if(ImGui::BeginTabItem("Textures")) {
            drawGui_texturesTab();
            ImGui::EndTabItem();
        }
        if(ImGui::BeginTabItem("Buffers")) {
            drawGui_buffersTab();
            ImGui::EndTabItem();
        }
        if(ImGui::BeginTabItem("BufferViews")) {
            drawGui_bufferViewsTab();
            ImGui::EndTabItem();
        }
        if(ImGui::BeginTabItem("Accessors")) {
            drawGui_accessorsTab();
            ImGui::EndTabItem();
        }
        if(ImGui::BeginTabItem("Materials")) {
            drawGui_materialsTab();
            ImGui::EndTabItem();
        }
        if(ImGui::BeginTabItem("Skins")) {
            drawGui_skins();
            ImGui::EndTabItem();
        }
        if(ImGui::BeginTabItem("Animations")) {
            drawGui_animations();
            ImGui::EndTabItem();
        }
        if(ImGui::BeginTabItem("Cameras")) {
            drawGui_cameras();
            ImGui::EndTabItem();
        }
        if(ImGui::BeginTabItem("Lights")) {
            drawGui_lights();
            ImGui::EndTabItem();
        }

        if(ImGui::BeginTabItem("Options")) {
            drawGui_options();
            ImGui::EndTabItem();
        }

        ImGui::EndTabBar();
    }

    ImGui::End();
}